

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

void Abc_NtkFinMiterCollect(Abc_Ntk_t *pNtk,Vec_Int_t *vCos,Vec_Int_t *vCis,Vec_Int_t *vNodes)

{
  ulong uVar1;
  int iVar2;
  long *plVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  
  vCis->nSize = 0;
  vNodes->nSize = 0;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar2 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar5 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar5) {
      piVar4 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar5;
    }
    if (-500 < iVar2) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar5;
  }
  iVar2 = pNtk->nTravIds;
  pNtk->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    if (0 < vCos->nSize) {
      lVar6 = 0;
      do {
        iVar2 = vCos->pArray[lVar6];
        if (((long)iVar2 < 0) || (pNtk->vObjs->nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        plVar3 = (long *)pNtk->vObjs->pArray[iVar2];
        if (plVar3 != (long *)0x0) {
          Abc_NtkFinMiterCollect_rec
                    (*(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8),vCis,
                     vNodes);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < vCos->nSize);
    }
    return;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkFinMiterCollect( Abc_Ntk_t * pNtk, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes )
{
    Abc_Obj_t * pObj; int i;
    Vec_IntClear( vCis );
    Vec_IntClear( vNodes );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachObjVec( vCos, pNtk, pObj, i )
        Abc_NtkFinMiterCollect_rec( Abc_ObjFanin0(pObj), vCis, vNodes );
}